

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void ddPatchTree(DdManager *dd,MtrNode *treenode)

{
  MtrNode *local_20;
  MtrNode *auxnode;
  MtrNode *treenode_local;
  DdManager *dd_local;
  
  for (local_20 = treenode; local_20 != (MtrNode *)0x0; local_20 = local_20->younger) {
    local_20->low = dd->perm[local_20->index];
    if (local_20->child != (MtrNode *)0x0) {
      ddPatchTree(dd,local_20->child);
    }
  }
  return;
}

Assistant:

static void
ddPatchTree(
  DdManager *dd,
  MtrNode *treenode)
{
    MtrNode *auxnode = treenode;

    while (auxnode != NULL) {
        auxnode->low = dd->perm[auxnode->index];
        if (auxnode->child != NULL) {
            ddPatchTree(dd, auxnode->child);
        }
        auxnode = auxnode->younger;
    }

    return;

}